

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O1

void deblock_edge_luma_hor(pel *src,int stride,int Alpha,int Beta,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint local_98;
  
  uVar6 = (ulong)((~edge_flag & 1U) << 2);
  iVar11 = Beta + 3;
  if (-1 < Beta) {
    iVar11 = Beta;
  }
  lVar7 = 0;
  while( true ) {
    bVar1 = src[lVar7 + (uVar6 - (long)(stride * 2))];
    bVar2 = src[lVar7 + (uVar6 - (long)stride)];
    bVar3 = src[lVar7 + uVar6];
    bVar4 = src[lVar7 + uVar6 + (long)stride];
    uVar8 = (uint)bVar3 - (uint)bVar2;
    uVar5 = -uVar8;
    if (0 < (int)uVar8) {
      uVar5 = uVar8;
    }
    uVar9 = (uint)bVar1 - (uint)bVar2;
    uVar8 = -uVar9;
    if (0 < (int)uVar9) {
      uVar8 = uVar9;
    }
    uVar12 = (uint)bVar3 - (uint)bVar4;
    uVar9 = -uVar12;
    if (0 < (int)uVar12) {
      uVar9 = uVar12;
    }
    uVar13 = (uint)src[lVar7 + (uVar6 - (long)(stride * 3))] - (uint)bVar2;
    uVar12 = -uVar13;
    if (0 < (int)uVar13) {
      uVar12 = uVar13;
    }
    iVar10 = (uint)((int)(uVar12 & 0xff) < Beta) + (uint)((int)(uVar8 & 0xff) < Beta) * 2;
    uVar12 = (uint)bVar3 - (uint)src[lVar7 + uVar6 + (long)(stride * 2)];
    uVar8 = -uVar12;
    if (0 < (int)uVar12) {
      uVar8 = uVar12;
    }
    iVar14 = (uint)((int)(uVar8 & 0xff) < Beta) + iVar10 + (uint)((int)(uVar9 & 0xff) < Beta) * 2;
    uVar8 = 0;
    if (iVar14 - 3U < 4) {
      switch(iVar14) {
      case 3:
        local_98 = (uint)bVar4;
        iVar14 = bVar1 - local_98;
        iVar10 = -iVar14;
        if (0 < iVar14) {
          iVar10 = iVar14;
        }
        uVar8 = (uint)(iVar10 < Beta);
        break;
      case 4:
        uVar8 = (iVar10 == 2) + 1;
        break;
      case 5:
        uVar8 = (bVar2 == bVar1 && bVar4 == bVar3) | 2;
        break;
      case 6:
        uVar8 = 3;
        if ((int)(uVar9 & 0xff) <= iVar11 >> 2) {
          iVar14 = (uint)bVar2 - (uint)bVar1;
          iVar10 = -iVar14;
          if (0 < iVar14) {
            iVar10 = iVar14;
          }
          if (iVar10 <= iVar11 >> 2) {
            uVar8 = ((int)(uVar5 & 0xff) < Alpha) + 3;
          }
        }
      }
    }
    if (uVar8 - 1 < 4) break;
    lVar7 = lVar7 + 1;
    if ((uint)((~edge_flag & 0x101U) == 0) * 4 + 4 == (int)lVar7) {
      return;
    }
  }
  (*(code *)(&DAT_0017e970 + *(int *)(&DAT_0017e970 + (ulong)(uVar8 - 1) * 4)))
            (bVar2,&DAT_0017e970 + *(int *)(&DAT_0017e970 + (ulong)(uVar8 - 1) * 4));
  return;
}

Assistant:

void deblock_edge_luma_hor(pel *src, int stride, int Alpha, int Beta, int edge_flag)
{
    int i, line_size = 8;
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int inc4 = inc + inc3;

    if ((edge_flag & 0x0101) != 0x0101) {
        line_size = 4;
    }
    if (!(edge_flag & 0x1)) {
        src += 4;
    }

    for (i = 0; i < line_size; i++, src++) {
        int L3 = src[-inc4];
        int L2 = src[-inc3];
        int L1 = src[-inc2];
        int L0 = src[-inc];
        int R0 = src[0];
        int R1 = src[inc];
        int R2 = src[inc2];
        int R3 = src[inc3];
        int abs0 = COM_ABS(R0 - L0);
        int flat_l = (COM_ABS(L1 - L0) < Beta) ? 2 : 0;
        int flat_r = (COM_ABS(R0 - R1) < Beta) ? 2 : 0;
        int fs;

        if (COM_ABS(L2 - L0) < Beta) {
            flat_l++;
        }
        if (COM_ABS(R0 - R2) < Beta) {
            flat_r++;
        }

        switch (flat_l + flat_r) {
        case 6:
            fs = (COM_ABS(R0 - R1) <= Beta / 4 && COM_ABS(L0 - L1) <= Beta / 4 && abs0 < Alpha) ? 4 : 3;
            break;
        case 5:
            fs = (R1 == R0 && L0 == L1) ? 3 : 2;
            break;
        case 4:
            fs = (flat_l == 2) ? 2 : 1;
            break;
        case 3:
            fs = (COM_ABS(L1 - R1) < Beta) ? 1 : 0;
            break;
        default:
            fs = 0;
            break;
        }

        switch (fs) {
        case 4:
            src[-inc3] = (pel)((((L3 + L2 + L1) << 1) + L0 + R0 + 4) >> 3);                         //L2
            src[-inc2] = (pel)((((L2 + L0 + L1) << 2) + L1 + R0 * 3 + 8) >> 4);                     //L1
            src[-inc ] = (pel)(((L2 + R1) * 3 + ((L1 + L0 + R0) << 3) + (L0 << 1) + 16) >> 5);      //L0
            src[ 0   ] = (pel)(((R2 + L1) * 3 + ((R1 + R0 + L0) << 3) + (R0 << 1) + 16) >> 5);      //R0
            src[ inc ] = (pel)((((R2 + R1 + R0) << 2) + R1 + L0 * 3 + 8) >> 4);                     //R1
            src[ inc2] = (pel)((((R3 + R2 + R1) << 1) + R0 + L0 + 4) >> 3);                         //R2
            break;
        case 3:
            src[-inc2] = (pel)((L2 * 3 + L1 * 8 + L0 * 4 + R0 + 8) >> 4);                           //L1
            src[-inc ] = (pel)((L2 + (L1 << 2) + (L0 << 2) + (L0 << 1) + (R0 << 2) + R1 + 8) >> 4); //L0
            src[ 0   ] = (pel)((L1 + (L0 << 2) + (R0 << 2) + (R0 << 1) + (R1 << 2) + R2 + 8) >> 4); //R0
            src[ inc ] = (pel)((R2 * 3 + R1 * 8 + R0 * 4 + L0 + 8) >> 4);                           //R2
            break;
        case 2:
            src[-inc] = (pel)(((L1 << 1) + L1 + (L0 << 3) + (L0 << 1) + (R0 << 1) + R0 + 8) >> 4);
            src[0] = (pel)(((L0 << 1) + L0 + (R0 << 3) + (R0 << 1) + (R1 << 1) + R1 + 8) >> 4);
            break;
        case 1:
            src[-inc] = (pel)((L0 * 3 + R0 + 2) >> 2);
            src[0] = (pel)((R0 * 3 + L0 + 2) >> 2);
            break;
        default:
            break;
        }
    }
}